

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O3

void skiwi::skiwi_repl(int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  size_type *psVar8;
  runtime_error *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  bool bVar11;
  string input;
  string filename;
  string arg;
  string command;
  string local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  ulong local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  ulong local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if ((anonymous_namespace)::cd != '\x01') {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < argc) {
    uVar10 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,argv[uVar10],(allocator<char> *)&local_130);
      skiwi_runf(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
  }
  if (DAT_002a8130 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (DAT_002a8130,(anonymous_namespace)::welcome_message_abi_cxx11_,DAT_002a7e40);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      poVar3 = DAT_002a8130;
      pcVar2 = (anonymous_namespace)::prompt_abi_cxx11_;
      if (DAT_002a8130 != (ostream *)0x0) {
        if ((anonymous_namespace)::prompt_abi_cxx11_ == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)DAT_002a8130 + -0x18) + (int)DAT_002a8130);
        }
        else {
          sVar6 = strlen((anonymous_namespace)::prompt_abi_cxx11_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar2,sVar6);
        }
      }
      cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_150,cVar4);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + local_150._M_string_length);
      bVar11 = false;
      lVar7 = std::__cxx11::string::find_first_not_of((char)(string *)local_50,0x20);
      if (lVar7 != -1) {
        bVar11 = *(char *)((long)local_50[0] + lVar7) == ',';
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (bVar11) break;
      if (local_150._M_string_length != 0) {
        skiwi_run(&local_150);
      }
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_90,local_88 + (long)local_90);
    lVar7 = std::__cxx11::string::find_first_not_of((char)&local_110,0x20);
    if ((lVar7 == -1) || (local_110._M_dataplus._M_p[lVar7] != ',')) {
      __assert_fail("is_cmd_command(txt)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                    ,0x25b,
                    "std::string skiwi::(anonymous namespace)::get_cleaned_command(std::string)");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::find_first_not_of((char)&local_90,0x20);
    std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_90);
    cVar4 = (char)(string *)&local_130;
    lVar7 = std::__cxx11::string::find(cVar4,0x20);
    if (lVar7 == -1) {
      if (local_130 == &local_120) {
        local_c0._8_8_ = local_120._8_8_;
        local_d0 = &local_c0;
      }
      else {
        local_d0 = local_130;
      }
      local_c0._M_allocated_capacity = local_120._M_allocated_capacity;
      local_c8 = local_128;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_130);
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120._M_allocated_capacity + 1);
      }
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_c8 < 2) {
LAB_001e9f17:
      bVar11 = false;
    }
    else {
      bVar1 = local_d0->_M_local_buf[1];
      bVar11 = false;
      if (bVar1 < 0x65) {
        if (bVar1 == 0x3f) {
          iVar5 = std::__cxx11::string::compare((char *)&local_d0);
          if ((iVar5 == 0) && (DAT_002a8130 != (ostream *)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (DAT_002a8130,(anonymous_namespace)::help_abi_cxx11_,DAT_002a7e20);
          }
        }
        else {
          if (bVar1 != 0x61) goto LAB_001e9f1a;
          iVar5 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar5 == 0) {
            skiwi_show_assembly(&local_150);
          }
        }
        goto LAB_001e9f17;
      }
      if (bVar1 == 0x65) {
        iVar5 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar5 == 0) {
          skiwi_show_environment();
          goto LAB_001e9f17;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar5 == 0) {
          bVar11 = true;
          goto LAB_001e9f1a;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar5 == 0) {
          skiwi_show_expand(&local_150);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar5 == 0) {
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_150._M_dataplus._M_p,
                       local_150._M_dataplus._M_p + local_150._M_string_length);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_b0,local_a8 + (long)local_b0);
            lVar7 = std::__cxx11::string::find_first_not_of((char)&local_110,0x20);
            if ((lVar7 == -1) || (local_110._M_dataplus._M_p[lVar7] != ',')) {
              __assert_fail("is_cmd_command(txt)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/libskiwi.cpp"
                            ,0x266,
                            "std::string skiwi::(anonymous namespace)::get_cleaned_first_argument(std::string)"
                           );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::find_first_not_of((char)&local_b0,0x20);
            std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_b0);
            lVar7 = std::__cxx11::string::find(cVar4,0x20);
            if (lVar7 == -1) {
LAB_001e9e9c:
              paVar9 = &local_f0.field_2;
              psVar8 = &local_f0._M_string_length;
              local_f0._M_dataplus._M_p = (pointer)paVar9;
LAB_001e9eab:
              *psVar8 = 0;
              paVar9->_M_local_buf[0] = '\0';
            }
            else {
              std::__cxx11::string::substr((ulong)local_70,(ulong)&local_130);
              std::__cxx11::string::operator=((string *)&local_130,(string *)local_70);
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
              }
              lVar7 = std::__cxx11::string::find_first_not_of(cVar4,0x20);
              if (lVar7 == -1) goto LAB_001e9e9c;
              std::__cxx11::string::substr((ulong)local_70,(ulong)&local_130);
              std::__cxx11::string::operator=((string *)&local_130,(string *)local_70);
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
              }
              lVar7 = std::__cxx11::string::find(cVar4,0x20);
              if (lVar7 == -1) {
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                if (local_130 == &local_120) {
                  local_f0.field_2._8_8_ = local_120._8_8_;
                }
                else {
                  local_f0._M_dataplus._M_p = (pointer)local_130;
                }
                local_f0.field_2._M_allocated_capacity = local_120._M_allocated_capacity;
                psVar8 = &local_128;
                paVar9 = &local_120;
                local_130 = &local_120;
                goto LAB_001e9eab;
              }
              std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_130);
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,local_120._M_allocated_capacity + 1);
            }
            if (local_b0 != local_a0) {
              operator_delete(local_b0,local_a0[0] + 1);
            }
            skiwi_show_external_primitives(&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        goto LAB_001e9f17;
      }
      if (bVar1 == 0x6d) {
        iVar5 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar5 == 0) {
          skiwi_show_memory();
        }
        goto LAB_001e9f17;
      }
      if (bVar1 == 0x75) {
        iVar5 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar5 == 0) {
          skiwi_show_unresolved();
        }
        goto LAB_001e9f17;
      }
    }
LAB_001e9f1a:
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
    }
    if (bVar11) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void skiwi_repl(int argc, char** argv)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");

  for (int i = 1; i < argc; ++i)
    {
    std::string filename(argv[i]);
    skiwi_runf(filename);
    }

  out(welcome_message);
  std::string input;
  bool quit = false;
  while (!quit)
    {
    out(prompt.c_str());

    std::getline(std::cin, input);

    bool cmd = is_cmd_command(input);
    if (cmd)
      {
      std::string command = get_cleaned_command(input);
      if (command.size() < 2)
        continue;
      switch (command[1])
        {
        case '?':
        {
        if (command == ",?")
          {
          skiwi_show_help();
          }
        break;
        }
        case 'a':
        {
        if (command == ",asm")
          {
          skiwi_show_assembly(input);
          }
        break;
        }
        case 'e':
        {
        if (command == ",env")
          {
          skiwi_show_environment();
          }
        else if (command == ",exit")
          {
          quit = true;
          }
        else if (command == ",expand")
          {
          skiwi_show_expand(input);
          }
        else if (command == ",external")
          {
          std::string arg = get_cleaned_first_argument(input);
          skiwi_show_external_primitives(arg);
          }
        break;
        }
        case 'm':
        {
        if (command == ",mem")
          {
          skiwi_show_memory();
          }
        break;
        }
        case 'u':
        {
        if (command == ",unresolved")
          {
          skiwi_show_unresolved();
          }
        break;
        }
        }
      }
    else if (!input.empty())
      {
      skiwi_run(input);
      }
    }
  }